

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void embree::SceneGraph::set_motion_vector
               (Ref<embree::SceneGraph::Node> *node,avector<Vec3fa> *motion_vector)

{
  vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
  *pvVar1;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *this;
  float *pfVar2;
  Vec3fa *pVVar3;
  float *pfVar4;
  Node *pNVar5;
  size_t sVar6;
  void *pvVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  long *plVar14;
  long *plVar15;
  long *plVar16;
  long lVar17;
  size_t sVar18;
  vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
  *pvVar19;
  long *plVar20;
  size_t t;
  ulong uVar21;
  long *plVar22;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> local_a0;
  long *local_80;
  long *local_78;
  long *local_70;
  long *local_68;
  long *local_60;
  long *local_58;
  long *local_50;
  long *local_48;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::Node> local_38;
  
  if (node->ptr == (Node *)0x0) {
    plVar14 = (long *)0x0;
  }
  else {
    plVar14 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&TransformNode::typeinfo);
  }
  if (plVar14 == (long *)0x0) {
    if (node->ptr == (Node *)0x0) {
      plVar15 = (long *)0x0;
    }
    else {
      plVar15 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&GroupNode::typeinfo);
    }
    local_58 = plVar14;
    if (plVar15 == (long *)0x0) {
      if (node->ptr == (Node *)0x0) {
        local_80 = (long *)0x0;
      }
      else {
        local_80 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&TriangleMeshNode::typeinfo);
      }
      if (local_80 == (long *)0x0) {
        if (node->ptr == (Node *)0x0) {
          local_70 = (long *)0x0;
          local_78 = plVar15;
        }
        else {
          local_78 = plVar15;
          local_70 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&QuadMeshNode::typeinfo);
        }
        if (local_70 == (long *)0x0) {
          if (node->ptr == (Node *)0x0) {
            local_68 = (long *)0x0;
          }
          else {
            local_68 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&GridMeshNode::typeinfo);
          }
          if (local_68 == (long *)0x0) {
            if (node->ptr == (Node *)0x0) {
              local_50 = (long *)0x0;
            }
            else {
              local_50 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&HairSetNode::typeinfo);
            }
            if (local_50 == (long *)0x0) {
              if (node->ptr == (Node *)0x0) {
                local_60 = (long *)0x0;
              }
              else {
                local_60 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&PointSetNode::typeinfo)
                ;
              }
              if (local_60 == (long *)0x0) {
                if (node->ptr == (Node *)0x0) {
                  plVar16 = (long *)0x0;
                }
                else {
                  plVar16 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,
                                                   &SubdivMeshNode::typeinfo,0);
                }
                if (plVar16 != (long *)0x0) {
                  (**(code **)(*plVar16 + 0x10))(plVar16);
                  lVar17 = plVar16[0xe];
                  sVar6 = *(size_t *)(lVar17 + 8);
                  pvVar7 = *(void **)(lVar17 + 0x18);
                  *(undefined8 *)(lVar17 + 8) = 0;
                  *(undefined8 *)(lVar17 + 0x10) = 0;
                  *(undefined8 *)(lVar17 + 0x18) = 0;
                  local_48 = plVar16;
                  std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::_M_erase_at_end((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                     *)(plVar16 + 0xe),(pointer)plVar16[0xe]);
                  if (motion_vector->size_active != 0) {
                    uVar21 = 0;
                    do {
                      local_a0.size_active = 0;
                      local_a0.size_alloced = 0;
                      local_a0.items = (Vec3fx *)0x0;
                      if ((sVar6 != 0) &&
                         (local_a0.items = (Vec3fx *)alignedMalloc(sVar6 << 4,0x10),
                         local_a0.size_alloced = sVar6, sVar6 != 0)) {
                        lVar17 = 0;
                        sVar18 = sVar6;
                        do {
                          pfVar4 = (float *)((long)pvVar7 + lVar17);
                          fVar8 = pfVar4[1];
                          fVar9 = pfVar4[2];
                          fVar10 = pfVar4[3];
                          pVVar3 = motion_vector->items + uVar21;
                          fVar11 = (pVVar3->field_0).m128[1];
                          fVar12 = (pVVar3->field_0).m128[2];
                          fVar13 = (pVVar3->field_0).m128[3];
                          pfVar2 = (float *)((long)&(local_a0.items)->field_0 + lVar17);
                          *pfVar2 = *pfVar4 + (pVVar3->field_0).m128[0];
                          pfVar2[1] = fVar8 + fVar11;
                          pfVar2[2] = fVar9 + fVar12;
                          pfVar2[3] = fVar10 + fVar13;
                          lVar17 = lVar17 + 0x10;
                          sVar18 = sVar18 - 1;
                        } while (sVar18 != 0);
                      }
                      local_a0.size_active = local_a0.size_alloced;
                      std::
                      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                      ::
                      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                                  *)(plVar16 + 0xe),
                                 (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                                  *)&local_a0);
                      alignedFree(local_a0.items);
                      local_a0.size_active = 0;
                      local_a0.size_alloced = 0;
                      local_a0.items = (Vec3fx *)0x0;
                      uVar21 = uVar21 + 1;
                    } while (uVar21 < motion_vector->size_active);
                  }
                  alignedFree(pvVar7);
                  plVar16 = local_48;
                }
                plVar20 = local_68;
                plVar22 = local_70;
                plVar15 = local_78;
                plVar14 = local_80;
                if (plVar16 != (long *)0x0) {
                  (**(code **)(*plVar16 + 0x18))();
                }
              }
              else {
                (**(code **)(*local_60 + 0x10))(local_60);
                pvVar1 = (vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                          *)(local_60 + 0xf);
                lVar17 = local_60[0xf];
                sVar6 = *(size_t *)(lVar17 + 8);
                pvVar7 = *(void **)(lVar17 + 0x18);
                *(undefined8 *)(lVar17 + 8) = 0;
                *(undefined8 *)(lVar17 + 0x10) = 0;
                *(undefined8 *)(lVar17 + 0x18) = 0;
                std::
                vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ::_M_erase_at_end((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                   *)pvVar1,(pointer)local_60[0xf]);
                if (motion_vector->size_active != 0) {
                  uVar21 = 0;
                  do {
                    local_a0.size_active = 0;
                    local_a0.size_alloced = 0;
                    local_a0.items = (Vec3fx *)0x0;
                    if ((sVar6 != 0) &&
                       (local_a0.items = (Vec3fx *)alignedMalloc(sVar6 << 4,0x10),
                       local_a0.size_alloced = sVar6, sVar6 != 0)) {
                      lVar17 = 0;
                      sVar18 = sVar6;
                      do {
                        pVVar3 = motion_vector->items + uVar21;
                        fVar8 = (pVVar3->field_0).m128[1];
                        fVar9 = (pVVar3->field_0).m128[2];
                        pfVar4 = (float *)((long)pvVar7 + lVar17);
                        fVar10 = pfVar4[1];
                        fVar11 = pfVar4[2];
                        fVar12 = pfVar4[3];
                        pfVar2 = (float *)((long)&(local_a0.items)->field_0 + lVar17);
                        *pfVar2 = (pVVar3->field_0).m128[0] + *pfVar4;
                        pfVar2[1] = fVar8 + fVar10;
                        pfVar2[2] = fVar9 + fVar11;
                        pfVar2[3] = fVar12 + 0.0;
                        lVar17 = lVar17 + 0x10;
                        sVar18 = sVar18 - 1;
                      } while (sVar18 != 0);
                    }
                    local_a0.size_active = local_a0.size_alloced;
                    std::
                    vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                    ::
                    emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                              (pvVar1,&local_a0);
                    alignedFree(local_a0.items);
                    local_a0.size_active = 0;
                    local_a0.size_alloced = 0;
                    local_a0.items = (Vec3fx *)0x0;
                    uVar21 = uVar21 + 1;
                  } while (uVar21 < motion_vector->size_active);
                }
                plVar20 = local_68;
                plVar15 = local_78;
                if ((local_60[0x13] != local_60[0x12]) && (1 < motion_vector->size_active)) {
                  this = (vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                          *)(local_60 + 0x12);
                  uVar21 = 1;
                  do {
                    std::
                    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ::push_back(this,(this->
                                     super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start);
                    uVar21 = uVar21 + 1;
                  } while (uVar21 < motion_vector->size_active);
                }
                alignedFree(pvVar7);
                plVar14 = local_80;
                plVar22 = local_70;
              }
              plVar16 = local_50;
              if (local_60 != (long *)0x0) {
                (**(code **)(*local_60 + 0x18))();
              }
            }
            else {
              (**(code **)(*local_50 + 0x10))(local_50);
              pvVar1 = (vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                        *)(local_50 + 0xf);
              lVar17 = local_50[0xf];
              sVar6 = *(size_t *)(lVar17 + 8);
              pvVar7 = *(void **)(lVar17 + 0x18);
              *(undefined8 *)(lVar17 + 8) = 0;
              *(undefined8 *)(lVar17 + 0x10) = 0;
              *(undefined8 *)(lVar17 + 0x18) = 0;
              std::
              vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ::_M_erase_at_end((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                 *)pvVar1,(pointer)local_50[0xf]);
              if (motion_vector->size_active != 0) {
                uVar21 = 0;
                do {
                  local_a0.size_active = 0;
                  local_a0.size_alloced = 0;
                  local_a0.items = (Vec3fx *)0x0;
                  if ((sVar6 != 0) &&
                     (local_a0.items = (Vec3fx *)alignedMalloc(sVar6 << 4,0x10),
                     local_a0.size_alloced = sVar6, sVar6 != 0)) {
                    lVar17 = 0;
                    sVar18 = sVar6;
                    do {
                      pVVar3 = motion_vector->items + uVar21;
                      fVar8 = (pVVar3->field_0).m128[1];
                      fVar9 = (pVVar3->field_0).m128[2];
                      pfVar4 = (float *)((long)pvVar7 + lVar17);
                      fVar10 = pfVar4[1];
                      fVar11 = pfVar4[2];
                      fVar12 = pfVar4[3];
                      pfVar2 = (float *)((long)&(local_a0.items)->field_0 + lVar17);
                      *pfVar2 = (pVVar3->field_0).m128[0] + *pfVar4;
                      pfVar2[1] = fVar8 + fVar10;
                      pfVar2[2] = fVar9 + fVar11;
                      pfVar2[3] = fVar12 + 0.0;
                      lVar17 = lVar17 + 0x10;
                      sVar18 = sVar18 - 1;
                    } while (sVar18 != 0);
                  }
                  local_a0.size_active = local_a0.size_alloced;
                  std::
                  vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                  ::
                  emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                            (pvVar1,&local_a0);
                  alignedFree(local_a0.items);
                  local_a0.size_active = 0;
                  local_a0.size_alloced = 0;
                  local_a0.items = (Vec3fx *)0x0;
                  uVar21 = uVar21 + 1;
                } while (uVar21 < motion_vector->size_active);
              }
              alignedFree(pvVar7);
              plVar14 = local_80;
              plVar20 = local_68;
              plVar16 = local_50;
              plVar22 = local_70;
              plVar15 = local_78;
            }
            if (plVar16 != (long *)0x0) {
              (**(code **)(*plVar16 + 0x18))(plVar16);
            }
          }
          else {
            (**(code **)(*local_68 + 0x10))(local_68);
            pvVar19 = (vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                       *)(local_68 + 0xe);
            lVar17 = local_68[0xe];
            sVar6 = *(size_t *)(lVar17 + 8);
            pvVar7 = *(void **)(lVar17 + 0x18);
            *(undefined8 *)(lVar17 + 8) = 0;
            *(undefined8 *)(lVar17 + 0x10) = 0;
            *(undefined8 *)(lVar17 + 0x18) = 0;
            std::
            vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ::_M_erase_at_end((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                               *)pvVar19,(pointer)local_68[0xe]);
            if (motion_vector->size_active != 0) {
              uVar21 = 0;
              do {
                local_a0.size_active = 0;
                local_a0.size_alloced = 0;
                local_a0.items = (Vec3fx *)0x0;
                if ((sVar6 != 0) &&
                   (local_a0.items = (Vec3fx *)alignedMalloc(sVar6 << 4,0x10),
                   local_a0.size_alloced = sVar6, sVar6 != 0)) {
                  lVar17 = 0;
                  sVar18 = sVar6;
                  do {
                    pfVar4 = (float *)((long)pvVar7 + lVar17);
                    fVar8 = pfVar4[1];
                    fVar9 = pfVar4[2];
                    fVar10 = pfVar4[3];
                    pVVar3 = motion_vector->items + uVar21;
                    fVar11 = (pVVar3->field_0).m128[1];
                    fVar12 = (pVVar3->field_0).m128[2];
                    fVar13 = (pVVar3->field_0).m128[3];
                    pfVar2 = (float *)((long)&(local_a0.items)->field_0 + lVar17);
                    *pfVar2 = *pfVar4 + (pVVar3->field_0).m128[0];
                    pfVar2[1] = fVar8 + fVar11;
                    pfVar2[2] = fVar9 + fVar12;
                    pfVar2[3] = fVar10 + fVar13;
                    lVar17 = lVar17 + 0x10;
                    sVar18 = sVar18 - 1;
                  } while (sVar18 != 0);
                }
                local_a0.size_active = local_a0.size_alloced;
                std::
                vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                ::
                emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                          (pvVar19,(vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                                    *)&local_a0);
                alignedFree(local_a0.items);
                local_a0.size_active = 0;
                local_a0.size_alloced = 0;
                local_a0.items = (Vec3fx *)0x0;
                uVar21 = uVar21 + 1;
              } while (uVar21 < motion_vector->size_active);
            }
            alignedFree(pvVar7);
            plVar14 = local_80;
            plVar20 = local_68;
            plVar22 = local_70;
            plVar15 = local_78;
          }
          if (plVar20 != (long *)0x0) {
            (**(code **)(*plVar20 + 0x18))(plVar20);
          }
        }
        else {
          (**(code **)(*local_70 + 0x10))(local_70);
          pvVar19 = (vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                     *)(local_70 + 0xe);
          lVar17 = local_70[0xe];
          sVar6 = *(size_t *)(lVar17 + 8);
          pvVar7 = *(void **)(lVar17 + 0x18);
          *(undefined8 *)(lVar17 + 8) = 0;
          *(undefined8 *)(lVar17 + 0x10) = 0;
          *(undefined8 *)(lVar17 + 0x18) = 0;
          std::
          vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ::_M_erase_at_end((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                             *)pvVar19,(pointer)local_70[0xe]);
          if (motion_vector->size_active != 0) {
            uVar21 = 0;
            do {
              local_a0.size_active = 0;
              local_a0.size_alloced = 0;
              local_a0.items = (Vec3fx *)0x0;
              if ((sVar6 != 0) &&
                 (local_a0.items = (Vec3fx *)alignedMalloc(sVar6 << 4,0x10),
                 local_a0.size_alloced = sVar6, sVar6 != 0)) {
                lVar17 = 0;
                sVar18 = sVar6;
                do {
                  pfVar4 = (float *)((long)pvVar7 + lVar17);
                  fVar8 = pfVar4[1];
                  fVar9 = pfVar4[2];
                  fVar10 = pfVar4[3];
                  pVVar3 = motion_vector->items + uVar21;
                  fVar11 = (pVVar3->field_0).m128[1];
                  fVar12 = (pVVar3->field_0).m128[2];
                  fVar13 = (pVVar3->field_0).m128[3];
                  pfVar2 = (float *)((long)&(local_a0.items)->field_0 + lVar17);
                  *pfVar2 = *pfVar4 + (pVVar3->field_0).m128[0];
                  pfVar2[1] = fVar8 + fVar11;
                  pfVar2[2] = fVar9 + fVar12;
                  pfVar2[3] = fVar10 + fVar13;
                  lVar17 = lVar17 + 0x10;
                  sVar18 = sVar18 - 1;
                } while (sVar18 != 0);
              }
              local_a0.size_active = local_a0.size_alloced;
              std::
              vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
              ::
              emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                        (pvVar19,(vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                                  *)&local_a0);
              alignedFree(local_a0.items);
              local_a0.size_active = 0;
              local_a0.size_alloced = 0;
              local_a0.items = (Vec3fx *)0x0;
              uVar21 = uVar21 + 1;
            } while (uVar21 < motion_vector->size_active);
          }
          alignedFree(pvVar7);
          plVar14 = local_80;
          plVar22 = local_70;
          plVar15 = local_78;
        }
        if (plVar22 != (long *)0x0) {
          (**(code **)(*plVar22 + 0x18))(plVar22);
        }
      }
      else {
        local_78 = plVar15;
        (**(code **)(*local_80 + 0x10))(local_80);
        pvVar19 = (vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                   *)(local_80 + 0xe);
        lVar17 = local_80[0xe];
        sVar6 = *(size_t *)(lVar17 + 8);
        pvVar7 = *(void **)(lVar17 + 0x18);
        *(undefined8 *)(lVar17 + 8) = 0;
        *(undefined8 *)(lVar17 + 0x10) = 0;
        *(undefined8 *)(lVar17 + 0x18) = 0;
        std::
        vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
        ::_M_erase_at_end((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                           *)pvVar19,(pointer)local_80[0xe]);
        if (motion_vector->size_active != 0) {
          uVar21 = 0;
          do {
            local_a0.size_active = 0;
            local_a0.size_alloced = 0;
            local_a0.items = (Vec3fx *)0x0;
            if ((sVar6 != 0) &&
               (local_a0.items = (Vec3fx *)alignedMalloc(sVar6 << 4,0x10),
               local_a0.size_alloced = sVar6, sVar6 != 0)) {
              lVar17 = 0;
              sVar18 = sVar6;
              do {
                pfVar2 = (float *)((long)pvVar7 + lVar17);
                fVar8 = pfVar2[1];
                fVar9 = pfVar2[2];
                fVar10 = pfVar2[3];
                pVVar3 = motion_vector->items + uVar21;
                fVar11 = (pVVar3->field_0).m128[1];
                fVar12 = (pVVar3->field_0).m128[2];
                fVar13 = (pVVar3->field_0).m128[3];
                pfVar4 = (float *)((long)&(local_a0.items)->field_0 + lVar17);
                *pfVar4 = *pfVar2 + (pVVar3->field_0).m128[0];
                pfVar4[1] = fVar8 + fVar11;
                pfVar4[2] = fVar9 + fVar12;
                pfVar4[3] = fVar10 + fVar13;
                lVar17 = lVar17 + 0x10;
                sVar18 = sVar18 - 1;
              } while (sVar18 != 0);
            }
            local_a0.size_active = local_a0.size_alloced;
            std::
            vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
            ::
            emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                      (pvVar19,(vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                                *)&local_a0);
            alignedFree(local_a0.items);
            local_a0.size_active = 0;
            local_a0.size_alloced = 0;
            local_a0.items = (Vec3fx *)0x0;
            uVar21 = uVar21 + 1;
          } while (uVar21 < motion_vector->size_active);
        }
        alignedFree(pvVar7);
        plVar14 = local_80;
        plVar15 = local_78;
      }
      if (plVar14 != (long *)0x0) {
        (**(code **)(*plVar14 + 0x18))(plVar14);
      }
    }
    else {
      (**(code **)(*plVar15 + 0x10))(plVar15);
      lVar17 = plVar15[0xd];
      if (plVar15[0xe] != lVar17) {
        uVar21 = 0;
        local_78 = plVar15;
        do {
          pNVar5 = *(Node **)(lVar17 + uVar21 * 8);
          local_40.ptr = pNVar5;
          if (pNVar5 != (Node *)0x0) {
            (*(pNVar5->super_RefCount)._vptr_RefCount[2])(pNVar5);
          }
          set_motion_vector(&local_40,motion_vector);
          if (pNVar5 != (Node *)0x0) {
            (*(pNVar5->super_RefCount)._vptr_RefCount[3])(pNVar5);
          }
          uVar21 = uVar21 + 1;
          lVar17 = local_78[0xd];
          plVar15 = local_78;
        } while (uVar21 < (ulong)(local_78[0xe] - lVar17 >> 3));
      }
    }
    plVar14 = local_58;
    if (plVar15 != (long *)0x0) {
      (**(code **)(*plVar15 + 0x18))(plVar15);
    }
  }
  else {
    (**(code **)(*plVar14 + 0x10))(plVar14);
    pNVar5 = (Node *)plVar14[0x13];
    local_38.ptr = pNVar5;
    if (pNVar5 != (Node *)0x0) {
      (*(pNVar5->super_RefCount)._vptr_RefCount[2])(pNVar5);
    }
    set_motion_vector(&local_38,motion_vector);
    if (pNVar5 != (Node *)0x0) {
      (*(pNVar5->super_RefCount)._vptr_RefCount[3])(pNVar5);
    }
  }
  if (plVar14 != (long *)0x0) {
    (**(code **)(*plVar14 + 0x18))(plVar14);
  }
  return;
}

Assistant:

void SceneGraph::set_motion_vector(Ref<SceneGraph::Node> node, const avector<Vec3fa>& motion_vector)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      set_motion_vector(xfmNode->child,motion_vector);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        set_motion_vector(groupNode->children[i],motion_vector);
    }
    else if (Ref<SceneGraph::TriangleMeshNode> mesh = node.dynamicCast<SceneGraph::TriangleMeshNode>()) 
    {
      avector<Vec3fa> positions = std::move(mesh->positions[0]);
      mesh->positions.clear();
      for (size_t t=0; t<motion_vector.size(); t++) {
        avector<Vec3fa> tpositions(positions.size());
        for (size_t i=0; i<positions.size(); i++) tpositions[i] = positions[i] + motion_vector[t];
        mesh->positions.push_back(std::move(tpositions));
      }
    }
    else if (Ref<SceneGraph::QuadMeshNode> mesh = node.dynamicCast<SceneGraph::QuadMeshNode>()) 
    {
      avector<Vec3fa> positions = std::move(mesh->positions[0]);
      mesh->positions.clear();
      for (size_t t=0; t<motion_vector.size(); t++) {
        avector<Vec3fa> tpositions(positions.size());
        for (size_t i=0; i<positions.size(); i++) tpositions[i] = positions[i] + motion_vector[t];
        mesh->positions.push_back(std::move(tpositions));
      }
    }
    else if (Ref<SceneGraph::GridMeshNode> mesh = node.dynamicCast<SceneGraph::GridMeshNode>()) 
    {
      avector<Vec3fa> positions = std::move(mesh->positions[0]);
      mesh->positions.clear();
      for (size_t t=0; t<motion_vector.size(); t++) {
        avector<Vec3fa> tpositions(positions.size());
        for (size_t i=0; i<positions.size(); i++) tpositions[i] = positions[i] + motion_vector[t];
        mesh->positions.push_back(std::move(tpositions));
      }
    }
    else if (Ref<SceneGraph::HairSetNode> mesh = node.dynamicCast<SceneGraph::HairSetNode>()) 
    {
      avector<Vec3ff> positions = std::move(mesh->positions[0]);
      mesh->positions.clear();
      for (size_t t=0; t<motion_vector.size(); t++) {
        avector<Vec3ff> tpositions(positions.size());
        for (size_t i=0; i<positions.size(); i++) tpositions[i] = positions[i] + Vec3ff(motion_vector[t],0.0f);
        mesh->positions.push_back(std::move(tpositions));
      }
    }
    else if (Ref<SceneGraph::PointSetNode> mesh = node.dynamicCast<SceneGraph::PointSetNode>())
    {
      avector<Vec3ff> positions = std::move(mesh->positions[0]);
      mesh->positions.clear();
      for (size_t t=0; t<motion_vector.size(); t++) {
        avector<Vec3ff> tpositions(positions.size());
        for (size_t i=0; i<positions.size(); i++) tpositions[i] = positions[i] + Vec3ff(motion_vector[t],0.0f);
        mesh->positions.push_back(std::move(tpositions));
      }
      if (mesh->normals.size()) {
        for (size_t t=1; t<motion_vector.size(); t++)
          mesh->normals.push_back(mesh->normals[0]);
      }
    }
    else if (Ref<SceneGraph::SubdivMeshNode> mesh = node.dynamicCast<SceneGraph::SubdivMeshNode>())
    {
      avector<Vec3fa> positions = std::move(mesh->positions[0]);
      mesh->positions.clear();
      for (size_t t=0; t<motion_vector.size(); t++) {
        avector<Vec3fa> tpositions(positions.size());
        for (size_t i=0; i<positions.size(); i++) tpositions[i] = positions[i] + motion_vector[t];
        mesh->positions.push_back(std::move(tpositions));
      }
    }
  }